

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sessions.hpp
# Opt level: O1

void __thiscall
ableton::link::
Sessions<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>_&,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::MeasurePeer,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::JoinSessionCallback,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_ableton::platforms::linux::Clock<1>_>
::handleFailedMeasurement
          (Sessions<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>_&,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::MeasurePeer,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::JoinSessionCallback,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_ableton::platforms::linux::Clock<1>_>
           *this,SessionId *id)

{
  pair<__gnu_cxx::__normal_iterator<ableton::link::Session_*,_std::vector<ableton::link::Session,_std::allocator<ableton::link::Session>_>_>,___gnu_cxx::__normal_iterator<ableton::link::Session_*,_std::vector<ableton::link::Session,_std::allocator<ableton::link::Session>_>_>_>
  pVar1;
  NodeIdArray local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  if (*(long *)(this->mCurrent).sessionId.super_NodeIdArray._M_elems ==
      *(long *)(id->super_NodeIdArray)._M_elems) {
    local_48._M_elems[0] = '\0';
    local_48._M_elems[1] = 0xac;
    local_48._M_elems[2] = '#';
    local_48._M_elems[3] = 0xfc;
    local_48._M_elems[4] = '\x06';
    local_48._M_elems[5] = '\0';
    local_48._M_elems[6] = '\0';
    local_48._M_elems[7] = '\0';
    asio::
    basic_waitable_timer<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>,_asio::waitable_timer_service<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>
    ::expires_from_now((this->mTimer).mpTimer._M_t.
                       super___uniq_ptr_impl<asio::basic_waitable_timer<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>,_asio::waitable_timer_service<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>,_asio::waitable_timer_service<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_asio::basic_waitable_timer<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>,_asio::waitable_timer_service<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>_*,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>,_asio::waitable_timer_service<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>_>_>
                       .
                       super__Head_base<0UL,_asio::basic_waitable_timer<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>,_asio::waitable_timer_service<std::chrono::_V2::system_clock,_asio::wait_traits<std::chrono::_V2::system_clock>_>_>_*,_false>
                       ._M_head_impl,(duration *)&local_48);
    platforms::asio::AsioTimer::
    async_wait<ableton::link::Sessions<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,std::reference_wrapper<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionPeerCounter>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionTimelineCallback>&,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::MeasurePeer,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::JoinSessionCallback,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,ableton::platforms::linux::Clock<1>>::scheduleRemeasurement()::_lambda(std::error_code)_1_>
              (&this->mTimer,(anon_class_8_1_8991fb9c_for_handler_conflict1)this);
  }
  else {
    local_48._M_elems = *&(id->super_NodeIdArray)._M_elems;
    local_40 = 0;
    uStack_38 = 0;
    local_30 = 0;
    uStack_28 = 0;
    local_20 = 0;
    uStack_18 = 0;
    pVar1 = std::
            __equal_range<__gnu_cxx::__normal_iterator<ableton::link::Session*,std::vector<ableton::link::Session,std::allocator<ableton::link::Session>>>,ableton::link::Session,__gnu_cxx::__ops::_Iter_comp_val<ableton::link::Sessions<ableton::link::Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>&,std::reference_wrapper<ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionPeerCounter>,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,ableton::platforms::linux::Clock<1>,ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,ableton::util::NullLog>>::SessionTimelineCallback>&,ableton::link::Controller<std::function<void(unsigned_long)>,std::function<void(ableton::link::Tempo)>,able___:posix::ScanIpIfAddrs,ableton::util::NullLog>&,ableton::platforms::linux::Clock<1>>::SessionIdComp>>
                      ((this->mOtherSessions).
                       super__Vector_base<ableton::link::Session,_std::allocator<ableton::link::Session>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->mOtherSessions).
                       super__Vector_base<ableton::link::Session,_std::allocator<ableton::link::Session>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if ((Session *)pVar1.first._M_current != pVar1.second._M_current._M_current) {
      std::vector<ableton::link::Session,_std::allocator<ableton::link::Session>_>::_M_erase
                (&this->mOtherSessions,(Session *)pVar1.first._M_current);
      Peers<ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_&,_std::reference_wrapper<ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionPeerCounter>,_ableton::link::Controller<std::function<void_(unsigned_long)>,_std::function<void_(ableton::link::Tempo)>,_ableton::platforms::linux::Clock<1>,_ableton::platforms::asio::Context<ableton::platforms::posix::ScanIpIfAddrs,_ableton::util::NullLog>_>::SessionTimelineCallback>
      ::forgetSession((this->mPeers).ref._M_data,id);
    }
  }
  return;
}

Assistant:

void handleFailedMeasurement(const SessionId& id)
  {
    using namespace std;

    debug(mIo->log()) << "Session " << id << " measurement failed.";

    // if we failed to measure for our current session, schedule a
    // retry in the future. Otherwise, remove the session from our set
    // of known sessions (if it is seen again it will be measured as
    // if new).
    if (mCurrent.sessionId == id)
    {
      scheduleRemeasurement();
    }
    else
    {
      const auto range = equal_range(
        begin(mOtherSessions), end(mOtherSessions), Session{id, {}, {}}, SessionIdComp{});
      if (range.first != range.second)
      {
        mOtherSessions.erase(range.first);
        mPeers->forgetSession(id);
      }
    }
  }